

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O3

int __thiscall
cinatra::http_parser::parse_response(http_parser *this,char *data,size_t size,int last_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int minor_version;
  int local_2c;
  size_t msg_len;
  char *msg;
  
  pcVar6 = data + size;
  minor_version = -1;
  this->status_ = 0;
  iVar3 = 0;
  msg = (char *)0x0;
  msg_len = 0;
  this->num_headers_ = 0;
  if (last_len != 0) {
    pcVar4 = data + (long)last_len + -3;
    if ((uint)last_len < 3) {
      pcVar4 = data;
    }
    do {
      iVar2 = -2;
      if (pcVar4 == pcVar6) goto LAB_00165b86;
      pcVar5 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_00165b2d:
        iVar1 = iVar3 + 1;
      }
      else {
        iVar1 = 0;
        if (*pcVar4 == '\r') {
          if (pcVar5 != pcVar6) {
            if (*pcVar5 == '\n') {
              pcVar5 = pcVar4 + 2;
              goto LAB_00165b2d;
            }
            iVar2 = -1;
          }
          goto LAB_00165b86;
        }
      }
      iVar3 = iVar1;
      pcVar4 = pcVar5;
    } while (iVar3 != 2);
  }
  pcVar6 = detail::parse_response
                     (data,pcVar6,&minor_version,&this->status_,&msg,&msg_len,
                      (this->headers_)._M_elems,&this->num_headers_,100,&local_2c);
  iVar2 = local_2c;
  if (pcVar6 != (char *)0x0) {
    iVar2 = (int)pcVar6 - (int)data;
  }
LAB_00165b86:
  this->header_len_ = iVar2;
  (this->msg_)._M_len = msg_len;
  (this->msg_)._M_str = msg;
  parse_body_len(this);
  iVar3 = this->header_len_;
  if ((iVar3 < 0) && (this->num_headers_ == 100)) {
    output_error(this);
    iVar3 = this->header_len_;
  }
  return iVar3;
}

Assistant:

int parse_response(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;
    const char *msg;
    size_t msg_len;
    header_len_ = cinatra::detail::phr_parse_response(
        data, size, &minor_version, &status_, &msg, &msg_len, headers_.data(),
        &num_headers_, last_len);
    msg_ = {msg, msg_len};
    parse_body_len();
    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
    }
    return header_len_;
  }